

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zesRasGetStateExp(zes_ras_handle_t hRas,uint32_t *pCount,zes_ras_state_exp_t *pState)

{
  ze_result_t zVar1;
  
  if (DAT_0010ed90 != (code *)0x0) {
    zVar1 = (*DAT_0010ed90)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasGetStateExp(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of RAS state structures that can be retrieved.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of error categories for which state can be retrieved.
                                                        ///< if count is greater than the number of RAS states available, then the
                                                        ///< driver shall update the value with the correct number of RAS states available.
        zes_ras_state_exp_t* pState                     ///< [in,out][optional][range(0, *pCount)] array of query results for RAS
                                                        ///< error states for different categories.
                                                        ///< if count is less than the number of RAS states available, then driver
                                                        ///< shall only retrieve that number of RAS states.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetStateExp = context.zesDdiTable.RasExp.pfnGetStateExp;
        if( nullptr != pfnGetStateExp )
        {
            result = pfnGetStateExp( hRas, pCount, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }